

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O0

string * flow::lang::escape(string *__return_storage_ptr__,string *value)

{
  bool bVar1;
  reference pcVar2;
  char value_00;
  string local_60;
  char local_39;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  char ch;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *value_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_38._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    local_39 = *pcVar2;
    escape_abi_cxx11_(&local_60,(lang *)(ulong)(uint)(int)local_39,value_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string escape(const std::string& value)  // {{{
{
  std::string result;

  for (const char ch : value) result += escape(ch);

  return result;
}